

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_buffer_block(CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t uVar4;
  SPIRType *type_00;
  size_type sVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  mapped_type *this_00;
  TypedID<(spirv_cross::Types)1> *pTVar8;
  string *psVar9;
  CompilerError *pCVar10;
  SPIRType *pSVar11;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  bool local_451;
  byte local_424;
  byte local_421;
  bool local_401;
  undefined1 local_400 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [39];
  char local_379;
  undefined1 local_378 [64];
  spirv_cross local_338 [32];
  uint32_t local_318;
  char local_312;
  allocator local_311;
  uint32_t failed_index_1;
  uint32_t local_2f0;
  allocator local_2e9;
  string local_2e8 [36];
  uint32_t local_2c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [32];
  spirv_cross local_2a0 [32];
  undefined1 local_280 [8];
  string member_name;
  string local_258 [8];
  string backup_name;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end3;
  TypedID<(spirv_cross::Types)1> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range3;
  undefined1 local_210 [4];
  uint32_t i;
  uint32_t local_1ec;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1e8;
  char local_1e0;
  char local_1d1;
  undefined1 local_1d0 [68];
  uint32_t local_18c;
  spirv_cross local_188 [4];
  uint32_t failed_index;
  uint32_t local_164;
  string local_160 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_140;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_138;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_130;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_128;
  key_type local_120 [8];
  string buffer_name;
  uint32_t local_fc;
  undefined1 local_f8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  TypedID<(spirv_cross::Types)0> *local_98;
  char *local_90;
  char *type_name;
  uint32_t local_80;
  bool is_interlocked;
  bool is_coherent;
  byte local_69;
  undefined1 local_68 [7];
  bool is_readonly;
  Bitset flags;
  bool is_uav;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  local_401 = true;
  if (var->storage != StorageClassStorageBuffer) {
    flags.higher._M_h._M_single_bucket._0_4_ = (type_00->super_IVariant).self.id;
    local_401 = Compiler::has_decoration
                          ((Compiler *)this,flags.higher._M_h._M_single_bucket._0_4_,
                           DecorationBufferBlock);
  }
  flags.higher._M_h._M_single_bucket._7_1_ = local_401;
  if (local_401 == false) {
    bVar1 = VectorView<unsigned_int>::empty(&(type_00->array).super_VectorView<unsigned_int>);
    uVar3 = (uint32_t)type_00;
    if (bVar1) {
      local_fc = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      pmVar6 = ::std::
               unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
               ::operator[](&(this->super_CompilerGLSL).flattened_structs,&local_fc);
      *pmVar6 = false;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_120,this,(ulong)uVar4,0);
      ::std::
      unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
      ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                   &(type_00->super_IVariant).self);
      bVar2 = ::std::__cxx11::string::empty();
      local_451 = true;
      if ((bVar2 & 1) == 0) {
        local_128._M_cur =
             (__node_type *)
             ::std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&(this->super_CompilerGLSL).resource_names,local_120);
        local_130._M_cur =
             (__node_type *)
             ::std::
             end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                       (&(this->super_CompilerGLSL).resource_names);
        bVar1 = ::std::__detail::operator!=(&local_128,&local_130);
        local_451 = true;
        if (!bVar1) {
          local_138._M_cur =
               (__node_type *)
               ::std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(this->super_CompilerGLSL).block_names,local_120);
          local_140._M_cur =
               (__node_type *)
               ::std::
               end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                         (&(this->super_CompilerGLSL).block_names);
          local_451 = ::std::__detail::operator!=(&local_138,&local_140);
        }
      }
      if (local_451 != false) {
        local_164 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[4])
                  (local_160,this,(ulong)local_164);
        ::std::__cxx11::string::operator=((string *)local_120,local_160);
        ::std::__cxx11::string::~string(local_160);
      }
      CompilerGLSL::add_variable
                (&this->super_CompilerGLSL,&(this->super_CompilerGLSL).block_names,
                 &(this->super_CompilerGLSL).resource_names,local_120);
      uVar7 = ::std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
        pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
        join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                  (local_188,(char (*) [2])0x4e3b4c,&(pSVar11->super_IVariant).self,
                   (char (*) [2])0x4e3b4c,&(var->super_IVariant).self);
        ::std::__cxx11::string::operator=((string *)local_120,(string *)local_188);
        ::std::__cxx11::string::~string((string *)local_188);
      }
      local_18c = 0;
      bVar1 = CompilerGLSL::buffer_is_packing_standard
                        (&this->super_CompilerGLSL,type_00,BufferPackingHLSLCbufferPackOffset,
                         &local_18c,0,0xffffffff);
      if (!bVar1) {
        local_1d1 = '\x01';
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_1d0,(SPIRType *)this,uVar3);
        join<char_const(&)[12],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string&,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                  ((spirv_cross *)(local_1d0 + 0x20),(char (*) [12])0x4e35ac,
                   &(var->super_IVariant).self,(char (*) [9])" (name: ",local_120,
                   (char (*) [17])"), member index ",&local_18c,(char (*) [9])" (name: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   (char (*) [69])
                   ") cannot be expressed with either HLSL packing layout or packoffset.");
        CompilerError::CompilerError(pCVar10,(string *)(local_1d0 + 0x20));
        local_1d1 = '\0';
        __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
      Compiler::set_extended_decoration((Compiler *)this,uVar4,SPIRVCrossDecorationExplicitOffset,0)
      ;
      pVar12 = ::std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(&(this->super_CompilerGLSL).block_names,local_120);
      local_1e8._M_cur =
           (__node_type *)
           pVar12.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_1e0 = pVar12.second;
      local_1ec = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      this_00 = ::std::
                unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&(this->super_CompilerGLSL).super_Compiler.declared_block_names,
                             &local_1ec);
      ::std::__cxx11::string::operator=((string *)this_00,(string *)local_120);
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&type_00->member_name_cache);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      CompilerGLSL::preserve_alias_on_reset(&this->super_CompilerGLSL,uVar4);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar4);
      to_resource_binding_abi_cxx11_((CompilerHLSL *)local_210,(SPIRVariable *)this);
      CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                (&this->super_CompilerGLSL,(char (*) [9])"cbuffer ",local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
      ::std::__cxx11::string::~string((string *)local_210);
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      __range3._4_4_ = 0;
      __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                         (&(type_00->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                         (&(type_00->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      for (; __end3 != pTVar8; __end3 = __end3 + 1) {
        CompilerGLSL::add_member_name(&this->super_CompilerGLSL,type_00,__range3._4_4_);
        id = TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
        psVar9 = Compiler::get_member_name_abi_cxx11_((Compiler *)this,(TypeID)id.id,__range3._4_4_)
        ;
        ::std::__cxx11::string::string(local_258,(string *)psVar9);
        CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_280,(SPIRType *)this,uVar3);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_2c0,this,(ulong)uVar4,1);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                  (local_2a0,local_2c0,(char (*) [2])0x4e3b4c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
        ::std::__cxx11::string::operator=((string *)local_280,(string *)local_2a0);
        ::std::__cxx11::string::~string((string *)local_2a0);
        ::std::__cxx11::string::~string((string *)local_2c0);
        ParsedIR::sanitize_underscores((string *)local_280);
        local_2c4 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
        Compiler::set_member_name
                  ((Compiler *)this,(TypeID)local_2c4,__range3._4_4_,(string *)local_280);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end3);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_2e8,"",&local_2e9);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                  (this,type_00,(ulong)uVar4,(ulong)__range3._4_4_,local_2e8,0);
        ::std::__cxx11::string::~string(local_2e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        local_2f0 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
        Compiler::set_member_name
                  ((Compiler *)this,(TypeID)local_2f0,__range3._4_4_,(string *)local_258);
        __range3._4_4_ = __range3._4_4_ + 1;
        ::std::__cxx11::string::~string((string *)local_280);
        ::std::__cxx11::string::~string(local_258);
      }
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
      ::std::__cxx11::string::~string((string *)local_120);
    }
    else {
      if (*(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x33) {
        local_312 = '\x01';
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&failed_index_1,
                   "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1."
                   ,&local_311);
        CompilerError::CompilerError(pCVar10,(string *)&failed_index_1);
        local_312 = '\0';
        __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar4);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar4);
      local_318 = 0;
      bVar1 = CompilerGLSL::buffer_is_packing_standard
                        (&this->super_CompilerGLSL,type_00,BufferPackingHLSLCbuffer,&local_318,0,
                         0xffffffff);
      if (!bVar1) {
        local_379 = '\x01';
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_378 + 0x20,this,(ulong)uVar4,1);
        CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_378,(SPIRType *)this,uVar3);
        join<char_const(&)[27],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[54]>
                  (local_338,(char (*) [27])"HLSL ConstantBuffer<T> ID ",&(var->super_IVariant).self
                   ,(char (*) [9])" (name: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_378 + 0x20),(char (*) [17])"), member index ",&local_318,
                   (char (*) [9])" (name: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                   (char (*) [54])") cannot be expressed with normal HLSL packing rules.");
        CompilerError::CompilerError(pCVar10,(string *)local_338);
        local_379 = '\0';
        __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
      pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar11);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_3a0,this,(ulong)uVar3,1);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_3c0,this,(ulong)uVar3,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])
                (local_400 + 0x20,this,type_00);
      to_resource_binding_abi_cxx11_((CompilerHLSL *)local_400,(SPIRVariable *)this);
      CompilerGLSL::
      statement<char_const(&)[16],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [16])"ConstantBuffer<",local_3a0,
                 (char (*) [3])0x4df6ec,local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_400 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400,
                 (char (*) [2])0x4d9ce2);
      ::std::__cxx11::string::~string((string *)local_400);
      ::std::__cxx11::string::~string((string *)(local_400 + 0x20));
      ::std::__cxx11::string::~string((string *)local_3c0);
      ::std::__cxx11::string::~string((string *)local_3a0);
    }
  }
  else {
    ParsedIR::get_buffer_block_flags
              ((Bitset *)local_68,&(this->super_CompilerGLSL).super_Compiler.ir,var);
    bVar1 = Bitset::get((Bitset *)local_68,0x18);
    local_421 = 0;
    if (bVar1) {
      local_80 = (var->super_IVariant).self.id;
      bVar1 = is_hlsl_force_storage_buffer_as_uav(this,(ID)local_80);
      local_421 = bVar1 ^ 0xff;
    }
    local_69 = local_421 & 1;
    bVar1 = Bitset::get((Bitset *)local_68,0x17);
    local_424 = 0;
    if (bVar1) {
      local_424 = local_69 ^ 0xff;
    }
    type_name._7_1_ = local_424 & 1;
    type_name._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self)
    ;
    sVar5 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                    (key_type *)&type_name);
    type_name._6_1_ = sVar5 != 0;
    local_90 = "ByteAddressBuffer ";
    if (((local_69 & 1) == 0) && (local_90 = "RWByteAddressBuffer ", (bool)type_name._6_1_)) {
      local_90 = "RasterizerOrderedByteAddressBuffer ";
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar3);
    local_98 = (TypedID<(spirv_cross::Types)0> *)0x4d8596;
    if ((type_name._7_1_ & 1) != 0) {
      local_98 = (TypedID<(spirv_cross::Types)0> *)0x4e346f;
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_b8,this,(ulong)uVar3,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(local_f8 + 0x20,this,type_00);
    to_resource_binding_abi_cxx11_((CompilerHLSL *)local_f8,(SPIRVariable *)this);
    CompilerGLSL::
    statement<char_const*,char_const*&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char **)&local_98,&local_90,local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_f8 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)local_f8);
    ::std::__cxx11::string::~string((string *)(local_f8 + 0x20));
    ::std::__cxx11::string::~string((string *)local_b8);
    Bitset::~Bitset((Bitset *)local_68);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	bool is_uav = var.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock);

	if (is_uav)
	{
		Bitset flags = ir.get_buffer_block_flags(var);
		bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
		bool is_coherent = flags.get(DecorationCoherent) && !is_readonly;
		bool is_interlocked = interlocked_resources.count(var.self) > 0;
		const char *type_name = "ByteAddressBuffer ";
		if (!is_readonly)
			type_name = is_interlocked ? "RasterizerOrderedByteAddressBuffer " : "RWByteAddressBuffer ";
		add_resource_name(var.self);
		statement(is_coherent ? "globallycoherent " : "", type_name, to_name(var.self), type_to_array_glsl(type),
		          to_resource_binding(var), ";");
	}
	else
	{
		if (type.array.empty())
		{
			// Flatten the top-level struct so we can use packoffset,
			// this restriction is similar to GLSL where layout(offset) is not possible on sub-structs.
			flattened_structs[var.self] = false;

			// Prefer the block name if possible.
			auto buffer_name = to_name(type.self, false);
			if (ir.meta[type.self].decoration.alias.empty() ||
			    resource_names.find(buffer_name) != end(resource_names) ||
			    block_names.find(buffer_name) != end(block_names))
			{
				buffer_name = get_block_fallback_name(var.self);
			}

			add_variable(block_names, resource_names, buffer_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (buffer_name.empty())
				buffer_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("cbuffer ID ", var.self, " (name: ", buffer_name, "), member index ",
				                       failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			block_names.insert(buffer_name);

			// Save for post-reflection later.
			declared_block_names[var.self] = buffer_name;

			type.member_name_cache.clear();
			// var.self can be used as a backup name for the block name,
			// so we need to make sure we don't disturb the name here on a recompile.
			// It will need to be reset if we have to recompile.
			preserve_alias_on_reset(var.self);
			add_resource_name(var.self);
			statement("cbuffer ", buffer_name, to_resource_binding(var));
			begin_scope();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				auto backup_name = get_member_name(type.self, i);
				auto member_name = to_member_name(type, i);
				member_name = join(to_name(var.self), "_", member_name);
				ParsedIR::sanitize_underscores(member_name);
				set_member_name(type.self, i, member_name);
				emit_struct_member(type, member, i, "");
				set_member_name(type.self, i, backup_name);
				i++;
			}

			end_scope_decl();
			statement("");
		}
		else
		{
			if (hlsl_options.shader_model < 51)
				SPIRV_CROSS_THROW(
				    "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1.");

			add_resource_name(type.self);
			add_resource_name(var.self);

			// ConstantBuffer<T> does not support packoffset, so it is unuseable unless everything aligns as we expect.
			uint32_t failed_index = 0;
			if (!buffer_is_packing_standard(type, BufferPackingHLSLCbuffer, &failed_index))
			{
				SPIRV_CROSS_THROW(join("HLSL ConstantBuffer<T> ID ", var.self, " (name: ", to_name(type.self),
				                       "), member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with normal HLSL packing rules."));
			}

			emit_struct(get<SPIRType>(type.self));
			statement("ConstantBuffer<", to_name(type.self), "> ", to_name(var.self), type_to_array_glsl(type),
			          to_resource_binding(var), ";");
		}
	}
}